

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

bool embree::avx::SphereMiIntersector1<4,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  ulong uVar9;
  float fVar10;
  byte bVar11;
  uint uVar12;
  byte bVar13;
  ulong uVar14;
  Scene *scene;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [64];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  int local_1ac;
  Primitive *local_1a8;
  float local_19c;
  RTCFilterFunctionNArguments local_198;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined8 local_15c;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  RayQueryContext *local_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 auVar41 [64];
  
  pSVar4 = context->scene;
  pGVar5 = (pSVar4->geometries).items[sphere->sharedGeomID].ptr;
  lVar6 = *(long *)&pGVar5->field_0x58;
  _Var7 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar18 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[0] * _Var7);
  auVar19 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[1] * _Var7);
  auVar23 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[2] * _Var7);
  auVar26 = *(undefined1 (*) [16])(lVar6 + (sphere->primIDs).field_0.i[3] * _Var7);
  auVar27 = vunpcklps_avx(auVar18,auVar23);
  auVar23 = vunpckhps_avx(auVar18,auVar23);
  auVar18 = vunpcklps_avx(auVar19,auVar26);
  auVar26 = vunpckhps_avx(auVar19,auVar26);
  auVar35 = vunpcklps_avx(auVar27,auVar18);
  auVar27 = vunpckhps_avx(auVar27,auVar18);
  auVar21 = vunpcklps_avx(auVar23,auVar26);
  auVar18 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar19 = vpcmpgtd_avx(auVar18,_DAT_01ff0cf0);
  local_48 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  aVar3 = (ray->dir).field_0;
  auVar18 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar15 = vunpckhps_avx(auVar23,auVar26);
  auVar23 = vrcpss_avx(auVar18,auVar18);
  auVar18 = ZEXT416((uint)(auVar23._0_4_ * (2.0 - auVar18._0_4_ * auVar23._0_4_)));
  auVar23 = vshufps_avx(auVar18,auVar18,0);
  uVar1 = *(undefined4 *)&(ray->org).field_0;
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18 = vsubps_avx(auVar35,auVar18);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26 = vsubps_avx(auVar27,auVar26);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27 = vsubps_avx(auVar21,auVar27);
  local_128 = (ray->dir).field_0.m128[0];
  fVar45 = (ray->dir).field_0.m128[1];
  fVar49 = (ray->dir).field_0.m128[2];
  auVar28._0_4_ =
       auVar23._0_4_ * (local_128 * auVar18._0_4_ + fVar45 * auVar26._0_4_ + fVar49 * auVar27._0_4_)
  ;
  auVar28._4_4_ =
       auVar23._4_4_ * (local_128 * auVar18._4_4_ + fVar45 * auVar26._4_4_ + fVar49 * auVar27._4_4_)
  ;
  auVar28._8_4_ =
       auVar23._8_4_ * (local_128 * auVar18._8_4_ + fVar45 * auVar26._8_4_ + fVar49 * auVar27._8_4_)
  ;
  auVar28._12_4_ =
       auVar23._12_4_ *
       (local_128 * auVar18._12_4_ + fVar45 * auVar26._12_4_ + fVar49 * auVar27._12_4_);
  auVar35._0_4_ = local_128 * auVar28._0_4_;
  auVar35._4_4_ = local_128 * auVar28._4_4_;
  auVar35._8_4_ = local_128 * auVar28._8_4_;
  auVar35._12_4_ = local_128 * auVar28._12_4_;
  auVar37._0_4_ = fVar45 * auVar28._0_4_;
  auVar37._4_4_ = fVar45 * auVar28._4_4_;
  auVar37._8_4_ = fVar45 * auVar28._8_4_;
  auVar37._12_4_ = fVar45 * auVar28._12_4_;
  auVar39._0_4_ = fVar49 * auVar28._0_4_;
  auVar39._4_4_ = fVar49 * auVar28._4_4_;
  auVar39._8_4_ = fVar49 * auVar28._8_4_;
  auVar39._12_4_ = fVar49 * auVar28._12_4_;
  auVar35 = vsubps_avx(auVar18,auVar35);
  auVar34 = ZEXT1664(auVar35);
  auVar26 = vsubps_avx(auVar26,auVar37);
  auVar36 = ZEXT1664(auVar26);
  auVar27 = vsubps_avx(auVar27,auVar39);
  auVar38 = ZEXT1664(auVar27);
  auVar31._0_4_ =
       auVar35._0_4_ * auVar35._0_4_ + auVar26._0_4_ * auVar26._0_4_ + auVar27._0_4_ * auVar27._0_4_
  ;
  auVar31._4_4_ =
       auVar35._4_4_ * auVar35._4_4_ + auVar26._4_4_ * auVar26._4_4_ + auVar27._4_4_ * auVar27._4_4_
  ;
  auVar31._8_4_ =
       auVar35._8_4_ * auVar35._8_4_ + auVar26._8_4_ * auVar26._8_4_ + auVar27._8_4_ * auVar27._8_4_
  ;
  auVar31._12_4_ =
       auVar35._12_4_ * auVar35._12_4_ +
       auVar26._12_4_ * auVar26._12_4_ + auVar27._12_4_ * auVar27._12_4_;
  auVar21._0_4_ = auVar15._0_4_ * auVar15._0_4_;
  auVar21._4_4_ = auVar15._4_4_ * auVar15._4_4_;
  auVar21._8_4_ = auVar15._8_4_ * auVar15._8_4_;
  auVar21._12_4_ = auVar15._12_4_ * auVar15._12_4_;
  auVar18 = vcmpps_avx(auVar31,auVar21,2);
  auVar15 = auVar19 & auVar18;
  if ((((auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar15[0xf] < '\0') {
    auVar18 = vandps_avx(auVar18,auVar19);
    auVar19 = vsubps_avx(auVar21,auVar31);
    auVar15._0_4_ = auVar23._0_4_ * auVar19._0_4_;
    auVar15._4_4_ = auVar23._4_4_ * auVar19._4_4_;
    auVar15._8_4_ = auVar23._8_4_ * auVar19._8_4_;
    auVar15._12_4_ = auVar23._12_4_ * auVar19._12_4_;
    auVar21 = vsqrtps_avx(auVar15);
    auVar53 = ZEXT1664(auVar21);
    auVar31 = vsubps_avx(auVar28,auVar21);
    auVar40._0_4_ = auVar21._0_4_ + auVar28._0_4_;
    auVar40._4_4_ = auVar21._4_4_ + auVar28._4_4_;
    auVar40._8_4_ = auVar21._8_4_ + auVar28._8_4_;
    auVar40._12_4_ = auVar21._12_4_ + auVar28._12_4_;
    auVar41 = ZEXT1664(auVar40);
    uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar22._4_4_ = uVar1;
    auVar22._0_4_ = uVar1;
    auVar22._8_4_ = uVar1;
    auVar22._12_4_ = uVar1;
    auVar19 = vcmpps_avx(auVar22,auVar31,2);
    fVar42 = ray->tfar;
    auVar29._4_4_ = fVar42;
    auVar29._0_4_ = fVar42;
    auVar29._8_4_ = fVar42;
    auVar29._12_4_ = fVar42;
    auVar23 = vcmpps_avx(auVar31,auVar29,2);
    auVar19 = vandps_avx(auVar23,auVar19);
    auVar32 = ZEXT1664(auVar19);
    auVar19 = vandps_avx(auVar19,auVar18);
    auVar23 = vcmpps_avx(auVar22,auVar40,2);
    auVar15 = vcmpps_avx(auVar40,auVar29,2);
    auVar23 = vandps_avx(auVar23,auVar15);
    auVar18 = vandps_avx(auVar23,auVar18);
    auVar33 = ZEXT1664(auVar18);
    auVar18 = vorps_avx(auVar19,auVar18);
    uVar12 = vmovmskps_avx(auVar18);
    if (uVar12 != 0) {
      auVar23._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
      auVar23._8_4_ = -auVar21._8_4_;
      auVar23._12_4_ = -auVar21._12_4_;
      local_118 = vblendvps_avx(auVar40,auVar31,auVar19);
      auVar18 = vblendvps_avx(auVar21,auVar23,auVar19);
      fVar42 = auVar18._0_4_;
      auVar24._0_4_ = local_128 * fVar42;
      fVar43 = auVar18._4_4_;
      auVar24._4_4_ = local_128 * fVar43;
      fVar44 = auVar18._8_4_;
      auVar24._8_4_ = local_128 * fVar44;
      fVar46 = auVar18._12_4_;
      auVar24._12_4_ = local_128 * fVar46;
      auVar30._0_4_ = fVar45 * fVar42;
      auVar30._4_4_ = fVar45 * fVar43;
      auVar30._8_4_ = fVar45 * fVar44;
      auVar30._12_4_ = fVar45 * fVar46;
      auVar19._0_4_ = fVar49 * fVar42;
      auVar19._4_4_ = fVar49 * fVar43;
      auVar19._8_4_ = fVar49 * fVar44;
      auVar19._12_4_ = fVar49 * fVar46;
      local_108 = vsubps_avx(auVar24,auVar35);
      local_f8 = vsubps_avx(auVar30,auVar26);
      local_e8 = vsubps_avx(auVar19,auVar27);
      uVar14 = (ulong)(uVar12 & 0xff);
      local_1a8 = sphere;
      fVar42 = local_128;
      fVar43 = local_128;
      fVar44 = local_128;
      fVar46 = fVar45;
      fVar47 = fVar45;
      fVar48 = fVar45;
      fVar50 = fVar49;
      fVar51 = fVar49;
      fVar52 = fVar49;
      do {
        local_198.hit = (RTCHitN *)&local_168;
        local_198.valid = &local_1ac;
        uVar9 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        local_150 = *(uint *)(local_48 + uVar9 * 4);
        pGVar5 = (pSVar4->geometries).items[local_150].ptr;
        local_198.ray = (RTCRayN *)ray;
        if ((pGVar5->mask & ray->mask) == 0) {
LAB_00e9fabd:
          uVar14 = uVar14 ^ 1L << (uVar9 & 0x3f);
          bVar13 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_154 = (local_1a8->primIDs).field_0.i[uVar9];
            local_168 = *(undefined4 *)(local_108 + uVar9 * 4);
            local_164 = *(undefined4 *)(local_f8 + uVar9 * 4);
            local_160 = *(undefined4 *)(local_e8 + uVar9 * 4);
            local_15c = 0;
            local_14c = context->user->instID[0];
            local_148 = context->user->instPrimID[0];
            local_19c = ray->tfar;
            ray->tfar = *(float *)(local_118 + uVar9 * 4);
            local_1ac = -1;
            local_198.geometryUserPtr = pGVar5->userPtr;
            local_198.context = context->user;
            local_198.N = 1;
            local_58 = fVar45;
            fStack_54 = fVar46;
            fStack_50 = fVar47;
            fStack_4c = fVar48;
            local_68 = fVar49;
            fStack_64 = fVar50;
            fStack_60 = fVar51;
            fStack_5c = fVar52;
            local_78 = auVar34._0_16_;
            local_88 = auVar36._0_16_;
            local_98 = auVar38._0_16_;
            local_a8 = auVar41._0_16_;
            local_b8 = auVar53._0_16_;
            local_c8 = auVar32._0_16_;
            local_d8 = auVar33._0_16_;
            fStack_124 = fVar42;
            fStack_120 = fVar43;
            fStack_11c = fVar44;
            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar5->occlusionFilterN)(&local_198);
              auVar33 = ZEXT1664(local_d8);
              auVar32 = ZEXT1664(local_c8);
              auVar53 = ZEXT1664(local_b8);
              auVar41 = ZEXT1664(local_a8);
              auVar38 = ZEXT1664(local_98);
              auVar36 = ZEXT1664(local_88);
              auVar34 = ZEXT1664(local_78);
              if (*local_198.valid != 0) goto LAB_00e9fc63;
LAB_00e9fd05:
              ray->tfar = local_19c;
              fVar42 = fStack_124;
              fVar43 = fStack_120;
              fVar44 = fStack_11c;
              fVar45 = local_58;
              fVar46 = fStack_54;
              fVar47 = fStack_50;
              fVar48 = fStack_4c;
              fVar49 = local_68;
              fVar50 = fStack_64;
              fVar51 = fStack_60;
              fVar52 = fStack_5c;
              goto LAB_00e9fabd;
            }
LAB_00e9fc63:
            p_Var8 = context->args->filter;
            fVar42 = fStack_124;
            fVar43 = fStack_120;
            fVar44 = fStack_11c;
            fVar45 = local_58;
            fVar46 = fStack_54;
            fVar47 = fStack_50;
            fVar48 = fStack_4c;
            fVar49 = local_68;
            fVar50 = fStack_64;
            fVar51 = fStack_60;
            fVar52 = fStack_5c;
            if (p_Var8 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var8)(&local_198);
                auVar33 = ZEXT1664(local_d8);
                auVar32 = ZEXT1664(local_c8);
                auVar53 = ZEXT1664(local_b8);
                auVar41 = ZEXT1664(local_a8);
                auVar38 = ZEXT1664(local_98);
                auVar36 = ZEXT1664(local_88);
                auVar34 = ZEXT1664(local_78);
              }
              fVar42 = fStack_124;
              fVar43 = fStack_120;
              fVar44 = fStack_11c;
              fVar45 = local_58;
              fVar46 = fStack_54;
              fVar47 = fStack_50;
              fVar48 = fStack_4c;
              fVar49 = local_68;
              fVar50 = fStack_64;
              fVar51 = fStack_60;
              fVar52 = fStack_5c;
              if (*local_198.valid == 0) goto LAB_00e9fd05;
            }
          }
          bVar13 = 0;
        }
      } while ((bVar13 != 0) && (uVar14 != 0));
      fVar2 = ray->tfar;
      auVar16._4_4_ = fVar2;
      auVar16._0_4_ = fVar2;
      auVar16._8_4_ = fVar2;
      auVar16._12_4_ = fVar2;
      auVar18 = vcmpps_avx(auVar41._0_16_,auVar16,2);
      auVar18 = vandps_avx(auVar32._0_16_,auVar18);
      auVar18 = vandps_avx(auVar18,auVar33._0_16_);
      uVar12 = vmovmskps_avx(auVar18);
      if (uVar12 == 0) {
        return (bool)(bVar13 ^ 1);
      }
      fVar2 = auVar53._0_4_;
      auVar17._0_4_ = local_128 * fVar2;
      fVar10 = auVar53._4_4_;
      auVar17._4_4_ = fVar42 * fVar10;
      fVar42 = auVar53._8_4_;
      auVar17._8_4_ = fVar43 * fVar42;
      fVar43 = auVar53._12_4_;
      auVar17._12_4_ = fVar44 * fVar43;
      auVar20._0_4_ = fVar45 * fVar2;
      auVar20._4_4_ = fVar46 * fVar10;
      auVar20._8_4_ = fVar47 * fVar42;
      auVar20._12_4_ = fVar48 * fVar43;
      auVar25._0_4_ = fVar49 * fVar2;
      auVar25._4_4_ = fVar50 * fVar10;
      auVar25._8_4_ = fVar51 * fVar42;
      auVar25._12_4_ = fVar52 * fVar43;
      local_108 = vsubps_avx(auVar17,auVar34._0_16_);
      local_f8 = vsubps_avx(auVar20,auVar36._0_16_);
      local_e8 = vsubps_avx(auVar25,auVar38._0_16_);
      local_118 = auVar41._0_16_;
      pSVar4 = context->scene;
      uVar14 = (ulong)(uVar12 & 0xff);
      local_130 = context;
      do {
        local_198.hit = (RTCHitN *)&local_168;
        local_198.valid = &local_1ac;
        uVar9 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        local_150 = *(uint *)(local_48 + uVar9 * 4);
        pGVar5 = (pSVar4->geometries).items[local_150].ptr;
        if ((pGVar5->mask & ray->mask) == 0) {
LAB_00e9fdc3:
          uVar14 = uVar14 ^ 1L << (uVar9 & 0x3f);
          bVar11 = 1;
        }
        else {
          if ((local_130->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_154 = (local_1a8->primIDs).field_0.i[uVar9];
            local_168 = *(undefined4 *)(local_108 + uVar9 * 4);
            local_164 = *(undefined4 *)(local_f8 + uVar9 * 4);
            local_160 = *(undefined4 *)(local_e8 + uVar9 * 4);
            local_15c = 0;
            local_14c = local_130->user->instID[0];
            local_148 = local_130->user->instPrimID[0];
            local_128 = ray->tfar;
            ray->tfar = *(float *)(local_118 + uVar9 * 4);
            local_1ac = -1;
            local_198.geometryUserPtr = pGVar5->userPtr;
            local_198.context = local_130->user;
            local_198.N = 1;
            local_198.ray = (RTCRayN *)ray;
            if ((pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) &&
               ((*pGVar5->occlusionFilterN)(&local_198), *local_198.valid == 0)) {
LAB_00e9ff0a:
              ray->tfar = local_128;
              goto LAB_00e9fdc3;
            }
            p_Var8 = local_130->args->filter;
            if (p_Var8 != (RTCFilterFunctionN)0x0) {
              if (((local_130->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var8)(&local_198);
              }
              if (*local_198.valid == 0) goto LAB_00e9ff0a;
            }
          }
          bVar11 = 0;
        }
        if ((bVar11 == 0) || (uVar14 == 0)) {
          return (bool)(bVar13 ^ 1 | bVar11 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }